

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O1

void __thiscall
icu_63::NumberFormat::getEffectiveCurrency(NumberFormat *this,UChar *result,UErrorCode *ec)

{
  char *locale;
  
  if (this->fCurrency[0] != L'\0') {
    u_strncpy_63(result,this->fCurrency,3);
    result[3] = L'\0';
    return;
  }
  locale = Format::getLocaleID(&this->super_Format,ULOC_VALID_LOCALE,ec);
  if (locale == (char *)0x0) {
    locale = uloc_getDefault_63();
  }
  ucurr_forLocale_63(locale,result,4,ec);
  return;
}

Assistant:

void NumberFormat::getEffectiveCurrency(UChar* result, UErrorCode& ec) const {
    const UChar* c = getCurrency();
    if (*c != 0) {
        u_strncpy(result, c, 3);
        result[3] = 0;
    } else {
        const char* loc = getLocaleID(ULOC_VALID_LOCALE, ec);
        if (loc == NULL) {
            loc = uloc_getDefault();
        }
        ucurr_forLocale(loc, result, 4, &ec);
    }
}